

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_regex.cpp
# Opt level: O2

any * __thiscall
Omega_h::regex::Reader::at_shift(any *__return_storage_ptr__,Reader *this,int token,string *text)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  ostream *poVar4;
  
  if (token == 0) {
    iVar1 = (int)text->_M_string_length;
    if (iVar1 == 2) {
      pcVar2 = (text->_M_dataplus)._M_p;
      if (*pcVar2 != '\\') {
        fail("assertion %s failed at %s +%d\n","text[0] == \'\\\\\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_regex.cpp"
             ,0xa5);
      }
      __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
      cVar3 = pcVar2[1];
    }
    else {
      if (iVar1 != 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"BUG: regex char text is \"");
        poVar4 = std::operator<<(poVar4,(string *)text);
        std::operator<<(poVar4,"\"\n");
        abort();
      }
      pcVar2 = (text->_M_dataplus)._M_p;
      __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
      cVar3 = *pcVar2;
    }
    *(char *)&__return_storage_ptr__->storage = cVar3;
  }
  else {
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

any regex::Reader::at_shift(int token, std::string& text) {
  if (token != TOK_CHAR) {
    return any();
  }
  if (size(text) == 1) {
    return any(text[0]);
  } else if (size(text) == 2) {
    OMEGA_H_CHECK(text[0] == '\\');
    return any(text[1]);
  } else {
    std::cerr << "BUG: regex char text is \"" << text << "\"\n";
    abort();
  }
}